

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O1

void __thiscall QTextTable::insertColumns(QTextTable *this,int pos,int num)

{
  QTextFormatCollection *this_00;
  pointer piVar1;
  QTextTablePrivate *this_01;
  QTextDocumentPrivate *this_02;
  int iVar2;
  pointer piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int charFormat;
  int blockFormat;
  int iVar7;
  ulong uVar8;
  long lVar9;
  pointer piVar10;
  uint fragment;
  uint uVar11;
  ulong uVar12;
  pointer piVar13;
  uint *puVar14;
  int iVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  QList<int> local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [12];
  undefined4 uStack_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < num) {
    uVar16 = (ulong)(uint)pos;
    this_01 = *(QTextTablePrivate **)&(this->super_QTextFrame).super_QTextObject.field_0x8;
    if (this_01->dirty == true) {
      QTextTablePrivate::update(this_01);
    }
    uVar6 = this_01->nCols;
    if ((int)uVar6 < pos) {
      uVar16 = (ulong)uVar6;
    }
    if (pos < 0) {
      uVar16 = (ulong)uVar6;
    }
    this_02 = (this_01->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
    iVar4 = this_02->editBlock;
    this_02->editBlock = iVar4 + 1;
    if (iVar4 == 0) {
      this_02->revision = this_02->revision + 1;
    }
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = (int *)0x0;
    local_98.d.size = 0;
    iVar4 = this_01->nRows;
    iVar2 = (int)uVar16;
    if (0 < iVar4) {
      this_00 = &this_02->formats;
      iVar7 = 1;
      if (1 < num) {
        iVar7 = num;
      }
      iVar15 = 0;
      do {
        if ((iVar15 != iVar4 + -1) || (iVar2 != this_01->nCols)) {
          if (iVar2 < 1) {
            iVar4 = -1;
LAB_00539217:
            uVar8 = (ulong)(this_01->nCols * iVar15 + iVar2);
            do {
              piVar10 = (this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((ulong)((long)(this_01->grid).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2) <=
                  uVar8) {
                insertColumns();
                goto LAB_0053978e;
              }
              fragment = piVar10[uVar8];
              iVar5 = QTextTablePrivate::findCellIndex(this_01,fragment);
              if (iVar4 <= iVar5) goto LAB_00539296;
              uVar8 = uVar8 + 1;
              lVar9 = (long)this_01->nCols * (long)this_01->nRows;
            } while ((long)uVar8 < lVar9);
            if ((int)uVar8 == (int)lVar9) goto LAB_00539283;
            goto LAB_00539296;
          }
          uVar8 = (ulong)(this_01->nCols * iVar15 + iVar2 + -1);
          piVar10 = (this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (uVar8 < (ulong)((long)(this_01->grid).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2))
          {
            iVar4 = QTextTablePrivate::findCellIndex(this_01,piVar10[uVar8]);
            goto LAB_00539217;
          }
          goto LAB_00539793;
        }
LAB_00539283:
        fragment = (this_01->super_QTextFramePrivate).fragment_end;
LAB_00539296:
        if ((0 < iVar2) && (iVar2 < this_01->nCols)) {
          uVar8 = (ulong)(this_01->nCols * iVar15 + iVar2 + -1);
          piVar10 = (this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (uVar8 < (ulong)((long)(this_01->grid).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2))
          {
            if (fragment != piVar10[uVar8]) goto LAB_005393bd;
            if (local_98.d.size == 0) {
LAB_0053931e:
              piVar10 = (pointer)0xffffffffffffffff;
            }
            else {
              piVar13 = (pointer)0xfffffffffffffffc;
              do {
                piVar1 = piVar13 + -local_98.d.size;
                if (piVar1 == (pointer)0xfffffffffffffffc) goto LAB_00539318;
                piVar10 = piVar13 + 1;
                piVar3 = piVar13 + 1;
                piVar13 = piVar10;
              } while (*(uint *)((long)local_98.d.ptr + (long)piVar3) != fragment);
              piVar10 = (pointer)((long)piVar10 >> 2);
LAB_00539318:
              if (piVar1 == (pointer)0xfffffffffffffffc) goto LAB_0053931e;
            }
            if (piVar10 == (pointer)0xffffffffffffffff) {
              stack0xffffffffffffffa0 = (undefined1 *)CONCAT44(0xaaaaaaaa,fragment);
              local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_68._0_8_ = &this_02->fragments;
              QTextFormatCollection::format((QTextFormatCollection *)&local_58,(int)this_00);
              QTextFormat::toCharFormat((QTextFormat *)local_78);
              QTextFormat::~QTextFormat((QTextFormat *)&local_58);
              iVar4 = QTextFormat::intProperty((QTextFormat *)local_78,0x4811);
              iVar4 = iVar4 + num + (uint)(iVar4 == 0);
              if (iVar4 < 2) {
                QTextFormat::clearProperty((QTextFormat *)local_78,0x4811);
              }
              else {
                ::QVariant::QVariant((QVariant *)&local_58,iVar4);
                QTextFormat::setProperty((QTextFormat *)local_78,0x4811,(QVariant *)&local_58);
                ::QVariant::~QVariant((QVariant *)&local_58);
              }
              iVar4 = QFragmentMap<QTextFragmentData>::ConstIterator::position
                                ((ConstIterator *)local_68);
              QTextDocumentPrivate::setCharFormat
                        (this_02,iVar4,1,(QTextCharFormat *)local_78,SetFormat);
              this_01->dirty = true;
              local_58._0_4_ = fragment;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_98,local_98.d.size,(int *)local_58.data);
              QList<int>::end(&local_98);
              QTextFormat::~QTextFormat((QTextFormat *)local_78);
            }
            goto LAB_00539553;
          }
          goto LAB_00539798;
        }
LAB_005393bd:
        if ((iVar15 != 0) && (iVar4 = this_01->nCols, iVar2 < iVar4)) {
          uVar12 = (ulong)((iVar15 + -1) * iVar4 + iVar2);
          piVar10 = (this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar8 = (long)(this_01->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar10 >> 2;
          if (uVar8 <= uVar12) goto LAB_0053979d;
          if (fragment != piVar10[uVar12]) goto LAB_00539477;
          uVar11 = iVar4 * iVar15 + iVar2;
          uVar12 = (ulong)uVar11;
          uVar6 = iVar4 * this_01->nRows - 1;
          if ((int)uVar11 < (int)uVar6) {
            uVar12 = (ulong)(iVar4 * iVar15 + iVar2);
            do {
              if (uVar8 <= uVar12) goto LAB_0053978e;
              if (fragment != piVar10[uVar12]) goto LAB_00539448;
              uVar12 = uVar12 + 1;
            } while ((long)uVar12 < (long)(int)uVar6);
            uVar12 = (ulong)uVar6;
          }
LAB_00539448:
          uVar11 = (uint)uVar12;
          puVar14 = &(this_01->super_QTextFramePrivate).fragment_end;
          if (uVar11 == uVar6) {
LAB_00539466:
            fragment = *puVar14;
            goto LAB_00539477;
          }
          if ((ulong)(long)(int)uVar11 < uVar8) {
            puVar14 = (uint *)(piVar10 + (int)uVar11);
            goto LAB_00539466;
          }
          goto LAB_005397a2;
        }
LAB_00539477:
        stack0xffffffffffffffa0 = (undefined1 *)CONCAT44(0xaaaaaaaa,fragment);
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = &this_02->fragments;
        QTextFormatCollection::format((QTextFormatCollection *)&local_58,(int)this_00);
        QTextFormat::toCharFormat((QTextFormat *)local_78);
        QTextFormat::~QTextFormat((QTextFormat *)&local_58);
        QTextFormat::clearProperty((QTextFormat *)local_78,0x4810);
        QTextFormat::clearProperty((QTextFormat *)local_78,0x4811);
        iVar5 = QFragmentMap<QTextFragmentData>::ConstIterator::position((ConstIterator *)local_68);
        charFormat = QTextFormatCollection::indexForFormat(this_00,(QTextFormat *)local_78);
        QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_58);
        blockFormat = QTextFormatCollection::indexForFormat(this_00,(QTextFormat *)&local_58);
        QTextFormat::~QTextFormat((QTextFormat *)&local_58);
        iVar4 = iVar7;
        do {
          QTextDocumentPrivate::insertBlock
                    (this_02,(QChar)0xfdd0,iVar5,blockFormat,charFormat,MoveCursor);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        QTextFormat::~QTextFormat((QTextFormat *)local_78);
LAB_00539553:
        iVar15 = iVar15 + 1;
        iVar4 = this_01->nRows;
      } while (iVar15 < iVar4);
    }
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
    format((QTextTable *)local_68);
    iVar4 = QTextFormat::intProperty((QTextFormat *)local_68,0x4100);
    iVar7 = iVar4 + num + (uint)(iVar4 == 0);
    iVar4 = 0;
    if (iVar7 != 1) {
      iVar4 = iVar7;
    }
    ::QVariant::QVariant((QVariant *)&local_58,iVar4);
    QTextFormat::setProperty((QTextFormat *)local_68,0x4100,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::lengthVectorProperty
              ((QList<QTextLength> *)&local_58,(QTextFormat *)local_68,0x4101);
    if ((undefined1 *)local_58._16_8_ != (undefined1 *)0x0) {
      uVar8 = 1;
      if (1 < iVar2) {
        uVar8 = uVar16;
      }
      iVar4 = num + 1;
      do {
        QtPrivate::QPodArrayOps<QTextLength>::emplace<QTextLength_const&>
                  ((QPodArrayOps<QTextLength> *)&local_58,(long)iVar2,
                   (QTextLength *)((undefined1 *)(local_58._8_8_ + uVar8 * 0x10) + -0x10));
        QList<QTextLength>::begin((QList<QTextLength> *)&local_58);
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
    }
    QTextFormat::setProperty((QTextFormat *)local_68,0x4101,(QList<QTextLength> *)&local_58);
    QTextObject::setFormat((QTextObject *)this,(QTextFormat *)local_68);
    QTextDocumentPrivate::endEditBlock(this_02);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,0x10,0x10);
      }
    }
    QTextFormat::~QTextFormat((QTextFormat *)local_68);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005397a7:
  __stack_chk_fail();
LAB_0053978e:
  insertColumns();
LAB_00539793:
  insertColumns();
LAB_00539798:
  insertColumns();
LAB_0053979d:
  insertColumns();
LAB_005397a2:
  insertColumns();
  goto LAB_005397a7;
}

Assistant:

void QTextTable::insertColumns(int pos, int num)
{
    Q_D(QTextTable);
    if (num <= 0)
        return;

    if (d->dirty)
        d->update();

    if (pos > d->nCols || pos < 0)
        pos = d->nCols;

//     qDebug() << "-------- insertCols" << pos << num;
    QTextDocumentPrivate *p = d->pieceTable;
    QTextFormatCollection *c = p->formatCollection();
    p->beginEditBlock();

    QList<int> extendedSpans;
    for (int i = 0; i < d->nRows; ++i) {
        int cell;
        if (i == d->nRows - 1 && pos == d->nCols) {
            cell = d->fragment_end;
        } else {
            int logicalGridIndexBeforePosition = pos > 0
                                                 ? d->findCellIndex(d->grid[i*d->nCols + pos - 1])
                                                 : -1;

            // Search for the logical insertion point by skipping past cells which are not the first
            // cell in a rowspan. This means any cell for which the logical grid index is
            // less than the logical cell index of the cell before the insertion.
            int logicalGridIndex;
            int gridArrayOffset = i*d->nCols + pos;
            do {
                cell = d->grid[gridArrayOffset];
                logicalGridIndex = d->findCellIndex(cell);
                gridArrayOffset++;
            } while (logicalGridIndex < logicalGridIndexBeforePosition
                     && gridArrayOffset < d->nRows*d->nCols);

            if (logicalGridIndex < logicalGridIndexBeforePosition
                && gridArrayOffset == d->nRows*d->nCols)
                cell = d->fragment_end;
        }

        if (pos > 0 && pos < d->nCols && cell == d->grid[i*d->nCols + pos - 1]) {
            // cell spans the insertion place, extend it
            if (!extendedSpans.contains(cell)) {
                QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
                QTextCharFormat fmt = c->charFormat(it->format);
                fmt.setTableCellColumnSpan(fmt.tableCellColumnSpan() + num);
                p->setCharFormat(it.position(), 1, fmt);
                d->dirty = true;
                extendedSpans << cell;
            }
        } else {
            /* If the next cell is spanned from the row above, we need to find the right position
            to insert to */
            if (i > 0 && pos < d->nCols && cell == d->grid[(i-1) * d->nCols + pos]) {
                int gridIndex = i*d->nCols + pos;
                const int gridEnd = d->nRows * d->nCols - 1;
                while (gridIndex < gridEnd && cell == d->grid[gridIndex]) {
                    ++gridIndex;
                }
                if (gridIndex == gridEnd)
                    cell = d->fragment_end;
                else
                    cell = d->grid[gridIndex];
            }
            QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
            QTextCharFormat fmt = c->charFormat(it->format);
            fmt.setTableCellRowSpan(1);
            fmt.setTableCellColumnSpan(1);
            Q_ASSERT(fmt.objectIndex() == objectIndex());
            int position = it.position();
            int cfmt = p->formatCollection()->indexForFormat(fmt);
            int bfmt = p->formatCollection()->indexForFormat(QTextBlockFormat());
            for (int i = 0; i < num; ++i)
                p->insertBlock(QTextBeginningOfFrame, position, bfmt, cfmt, QTextUndoCommand::MoveCursor);
        }
    }

    QTextTableFormat tfmt = format();
    tfmt.setColumns(tfmt.columns()+num);
    QList<QTextLength> columnWidths = tfmt.columnWidthConstraints();
    if (! columnWidths.isEmpty()) {
        for (int i = num; i > 0; --i)
            columnWidths.insert(pos, columnWidths.at(qMax(0, pos - 1)));
    }
    tfmt.setColumnWidthConstraints (columnWidths);
    QTextObject::setFormat(tfmt);

//     qDebug() << "-------- end insertCols" << pos << num;
    p->endEditBlock();
}